

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O1

void __thiscall
tchecker::clockbounds::clockbounds_t::clockbounds_t
          (clockbounds_t *this,loc_id_t loc_nb,clock_id_t clock_nb)

{
  global_lu_map_t *this_00;
  global_m_map_t *this_01;
  local_lu_map_t *this_02;
  local_m_map_t *this_03;
  
  this_00 = (global_lu_map_t *)operator_new(0x18);
  this_00->_clock_nb = 0;
  this_00->_L = (map_t *)0x0;
  this_00->_U = (map_t *)0x0;
  global_lu_map_t::resize(this_00,clock_nb);
  (this->_global_lu).
  super___shared_ptr<tchecker::clockbounds::global_lu_map_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<tchecker::clockbounds::global_lu_map_t*>
            (&(this->_global_lu).
              super___shared_ptr<tchecker::clockbounds::global_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,this_00);
  this_01 = (global_m_map_t *)operator_new(0x10);
  this_01->_clock_nb = 0;
  this_01->_M = (map_t *)0x0;
  global_m_map_t::resize(this_01,clock_nb);
  (this->_global_m).
  super___shared_ptr<tchecker::clockbounds::global_m_map_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<tchecker::clockbounds::global_m_map_t*>
            (&(this->_global_m).
              super___shared_ptr<tchecker::clockbounds::global_m_map_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_01);
  this_02 = (local_lu_map_t *)operator_new(0x38);
  local_lu_map_t::local_lu_map_t(this_02,loc_nb,clock_nb);
  (this->_local_lu).
  super___shared_ptr<tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this_02;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<tchecker::clockbounds::local_lu_map_t*>
            (&(this->_local_lu).
              super___shared_ptr<tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_02);
  this_03 = (local_m_map_t *)operator_new(0x20);
  local_m_map_t::local_m_map_t(this_03,loc_nb,clock_nb);
  (this->_local_m).
  super___shared_ptr<tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this_03;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<tchecker::clockbounds::local_m_map_t*>
            (&(this->_local_m).
              super___shared_ptr<tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_03);
  return;
}

Assistant:

clockbounds_t::clockbounds_t(tchecker::loc_id_t loc_nb, tchecker::clock_id_t clock_nb)
    : _global_lu(new tchecker::clockbounds::global_lu_map_t(clock_nb)),
      _global_m(new tchecker::clockbounds::global_m_map_t(clock_nb)),
      _local_lu(new tchecker::clockbounds::local_lu_map_t(loc_nb, clock_nb)),
      _local_m(new tchecker::clockbounds::local_m_map_t(loc_nb, clock_nb))
{
}